

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O3

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<wasm::SmallVector<wasm::Expression*,1ul>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          SmallVector<wasm::Expression_*,_1UL> *list)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  array<wasm::Expression_*,_1UL> *paVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar6 = ((long)(list->flexible).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(list->flexible).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start >> 3) + list->usedFixed;
  uVar2 = uVar6;
  if (*(ulong *)(this + 0x10) < uVar6) {
    *(ulong *)(this + 0x10) = uVar6;
    pvVar1 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),uVar6 * 8,8);
    *(void **)this = pvVar1;
    uVar2 = ((long)(list->flexible).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(list->flexible).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) + list->usedFixed;
  }
  if (uVar2 != 0) {
    lVar3 = -8;
    lVar4 = 0;
    do {
      bVar7 = lVar4 == 0;
      lVar4 = lVar4 + -1;
      paVar5 = (array<wasm::Expression_*,_1UL> *)
               ((long)(list->flexible).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar3);
      if (bVar7) {
        paVar5 = &list->fixed;
      }
      *(Expression **)(*(long *)this + 8 + lVar3) = paVar5->_M_elems[0];
      lVar3 = lVar3 + 8;
    } while (-lVar4 != uVar2);
  }
  *(ulong *)(this + 8) = uVar6;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }